

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj,REF_INT node)

{
  uint local_28;
  uint local_24;
  int local_20;
  uint local_1c;
  int local_18;
  REF_INT ref;
  REF_INT item;
  REF_INT node_local;
  REF_ADJ ref_adj_local;
  
  printf(" %d :",(ulong)(uint)node);
  if ((node < 0) || (ref_adj->nnode <= node)) {
    local_20 = -1;
  }
  else {
    local_20 = ref_adj->first[node];
  }
  local_18 = local_20;
  if (local_20 == -1) {
    local_24 = 0xffffffff;
  }
  else {
    local_24 = ref_adj->item[local_20].ref;
  }
  local_1c = local_24;
  while (local_18 != -1) {
    printf(" %d",(ulong)local_1c);
    local_18 = ref_adj->item[local_18].next;
    if (local_18 == -1) {
      local_28 = 0xffffffff;
    }
    else {
      local_28 = ref_adj->item[local_18].ref;
    }
    local_1c = local_28;
  }
  printf("\n");
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_node_inspect(REF_ADJ ref_adj, REF_INT node) {
  REF_INT item, ref;
  printf(" %d :", node);
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    printf(" %d", ref);
  }
  printf("\n");

  return REF_SUCCESS;
}